

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cast.h
# Opt level: O0

type_caster<Neyn::Response,_void> *
pybind11::detail::load_type<Neyn::Response,void>
          (type_caster<Neyn::Response,_void> *conv,handle *handle)

{
  bool bVar1;
  cast_error *this;
  handle h;
  str local_c8;
  str local_c0 [4];
  char local_a0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40 [32];
  PyObject *local_20;
  object_api<pybind11::handle> *local_18;
  handle *handle_local;
  type_caster<Neyn::Response,_void> *conv_local;
  
  local_20 = handle->m_ptr;
  local_18 = (object_api<pybind11::handle> *)handle;
  handle_local = (handle *)conv;
  bVar1 = type_caster_generic::load((type_caster_generic *)conv,(handle)local_20,true);
  if (!bVar1) {
    this = (cast_error *)__cxa_allocate_exception(0x10);
    h = object_api<pybind11::handle>::get_type(local_18);
    str::str(&local_c8,h);
    str::operator_cast_to_string(local_c0);
    std::operator+(local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            "Unable to cast Python instance of type ");
    std::operator+(local_80,local_a0);
    type_id<Neyn::Response>();
    std::operator+(local_60,local_80);
    std::operator+(local_40,(char *)local_60);
    cast_error::runtime_error(this,local_40);
    __cxa_throw(this,&cast_error::typeinfo,cast_error::~cast_error);
  }
  return (type_caster<Neyn::Response,_void> *)handle_local;
}

Assistant:

type_caster<T, SFINAE> &load_type(type_caster<T, SFINAE> &conv, const handle &handle) {
    if (!conv.load(handle, true)) {
#if defined(NDEBUG)
        throw cast_error("Unable to cast Python instance to C++ type (compile in debug mode for details)");
#else
        throw cast_error("Unable to cast Python instance of type " +
            (std::string) str(handle.get_type()) + " to C++ type '" + type_id<T>() + "'");
#endif
    }
    return conv;
}